

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osThread.cpp
# Opt level: O0

void * ThreadEntry(void *param)

{
  int local_1c;
  int i;
  osThread *thread;
  void *param_local;
  
  pthread_setspecific(tlsKey,param);
  osEvent::Notify((osEvent *)((long)param + 0x18));
  (**(code **)((long)param + 8))(*(undefined8 *)((long)param + 0x10));
  local_1c = 0;
  while( true ) {
    if (0x2f < local_1c) {
      return (void *)0x0;
    }
    if (Threads[local_1c] == (osThread *)param) break;
    local_1c = local_1c + 1;
  }
  Threads[local_1c] = (osThread *)0x0;
  return (void *)0x0;
}

Assistant:

static void* ThreadEntry(void* param)
{
    osThread* thread = (osThread*)param;
    pthread_setspecific(tlsKey, thread); // Thread Local Storage points to osThread
    thread->ThreadStart.Notify();
    thread->Entry(thread->Param);

    // Now remove self from active thread list
    for (int i = 0; i < MAX_THREADS; i++)
    {
        if (Threads[i] == thread)
        {
            Threads[i] = nullptr;
            break;
        }
    }

    return nullptr;
}